

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCString.h
# Opt level: O1

__ssize_t GenICam_3_4::getline(char **__lineptr,size_t *__n,FILE *__stream)

{
  string tmp;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)__lineptr,(string *)&local_40,(char)__stream);
  (**(code **)(*__n + 0x38))(__n,local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return (__ssize_t)__lineptr;
}

Assistant:

inline std::istream &  getline(std::istream& is, GENICAM_NAMESPACE::gcstring& str, char delim)
    {
        try
        {
            std::string tmp;
            std::getline(is, tmp, delim);
            str.assign(tmp.c_str(), tmp.size());
        }
        catch(std::bad_alloc &)
        {
            ThrowBadAlloc(__FILE__, __LINE__);
        }
        return is;
    }